

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall TPZSkylMatrix<double>::ReallocForNuma(TPZSkylMatrix<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  int64_t iVar5;
  double **ppdVar6;
  long in_RDI;
  int i;
  double *new_start;
  double *old_start;
  TPZVec<double_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  TPZVec<double_*>::ReallocForNuma(in_stack_ffffffffffffffd0);
  pdVar2 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x40),0);
  TPZVec<double>::ReallocForNuma((TPZVec<double> *)in_stack_ffffffffffffffd0);
  pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x40),0);
  local_1c = 0;
  while( true ) {
    lVar4 = (long)local_1c;
    iVar5 = TPZVec<double_*>::size((TPZVec<double_*> *)(in_RDI + 0x20));
    if (iVar5 <= lVar4) break;
    ppdVar6 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),(long)local_1c);
    pdVar1 = *ppdVar6;
    ppdVar6 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),(long)local_1c);
    *ppdVar6 = pdVar3 + ((long)pdVar1 - (long)pdVar2 >> 3);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}